

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfd_transaction.cpp
# Opt level: O1

ByteData256 *
cfd::CreateTxSighash
          (ByteData256 *__return_storage_ptr__,TransactionContext *transaction,OutPoint *outpoint,
          UtxoData *utxo,SigHashType *sighash_type,Pubkey *pubkey,Script *redeem_script,
          WitnessVersion version,ByteData *annex,TaprootScriptTree *script_tree)

{
  pointer puVar1;
  bool bVar2;
  ByteData256 *this;
  undefined8 in_stack_ffffffffffffff48;
  undefined4 uVar3;
  ByteData256 local_a8;
  ByteData local_88;
  ByteData256 *local_70;
  ByteData256 local_68;
  SigHashType local_48;
  SigHashType local_3c;
  
  uVar3 = (undefined4)((ulong)in_stack_ffffffffffffff48 >> 0x20);
  local_70 = __return_storage_ptr__;
  core::ByteData::ByteData(&local_88);
  if (version == kVersion1) {
    this = &local_a8;
    core::ByteData256::ByteData256(this);
    if (script_tree == (TaprootScriptTree *)0x0) {
      this = (ByteData256 *)0x0;
    }
    else {
      core::TaprootScriptTree::GetTapLeafHash(&local_68,script_tree);
      puVar1 = local_a8.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
               _M_impl.super__Vector_impl_data._M_start;
      local_a8.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start =
           local_68.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
           super__Vector_impl_data._M_start;
      local_a8.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_finish =
           local_68.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
           super__Vector_impl_data._M_finish;
      local_a8.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage =
           local_68.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
           super__Vector_impl_data._M_end_of_storage;
      local_68.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      local_68.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      local_68.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      if (puVar1 != (pointer)0x0) {
        operator_delete(puVar1);
      }
      if (local_68.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_68.data_.
                        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                        super__Vector_impl_data._M_start);
      }
    }
    TransactionContext::CreateSignatureHashByTaproot
              (local_70,transaction,outpoint,sighash_type,this,(uint32_t *)0x0,annex);
    if (local_a8.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_a8.data_.
                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                      super__Vector_impl_data._M_start);
    }
  }
  else {
    bVar2 = core::Script::IsEmpty(redeem_script);
    if (bVar2) {
      core::SigHashType::SigHashType(&local_3c,sighash_type);
      (*(transaction->super_Transaction).super_AbstractTransaction._vptr_AbstractTransaction[0x13])
                (&local_a8,transaction,outpoint,pubkey,&local_3c,&utxo->amount,
                 CONCAT44(uVar3,version));
    }
    else {
      core::SigHashType::SigHashType(&local_48,sighash_type);
      (*(transaction->super_Transaction).super_AbstractTransaction._vptr_AbstractTransaction[0x14])
                (&local_a8,transaction,outpoint,redeem_script,&local_48,&utxo->amount,
                 CONCAT44(uVar3,version));
    }
    puVar1 = local_88.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
             _M_impl.super__Vector_impl_data._M_start;
    local_88.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start =
         local_a8.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
         super__Vector_impl_data._M_start;
    local_88.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_finish =
         local_a8.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
         super__Vector_impl_data._M_finish;
    local_88.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage =
         local_a8.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
         super__Vector_impl_data._M_end_of_storage;
    local_a8.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    local_a8.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    local_a8.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    if (puVar1 != (pointer)0x0) {
      operator_delete(puVar1);
    }
    if (local_a8.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_a8.data_.
                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                      super__Vector_impl_data._M_start);
    }
    core::ByteData256::ByteData256(local_70,&local_88);
  }
  if (local_88.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_88.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                    ._M_impl.super__Vector_impl_data._M_start);
  }
  return local_70;
}

Assistant:

static ByteData256 CreateTxSighash(
    const TransactionContext* transaction, const OutPoint& outpoint,
    const UtxoData& utxo, const SigHashType& sighash_type,
    const Pubkey& pubkey, const Script& redeem_script, WitnessVersion version,
    const ByteData* annex, const TaprootScriptTree* script_tree) {
  ByteData sig;
  if (version == WitnessVersion::kVersion1) {
    ByteData256 tapleaf_hash;
    if (script_tree != nullptr) tapleaf_hash = script_tree->GetTapLeafHash();
    return transaction->CreateSignatureHashByTaproot(
        outpoint, sighash_type,
        (script_tree != nullptr) ? &tapleaf_hash : nullptr, 0, annex);
  } else if (redeem_script.IsEmpty()) {
    sig = transaction->CreateSignatureHash(
        outpoint, pubkey, sighash_type, utxo.amount, version);
  } else {
    sig = transaction->CreateSignatureHash(
        outpoint, redeem_script, sighash_type, utxo.amount, version);
  }
  return ByteData256(sig);
}